

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disci_intersector.h
# Opt level: O1

void embree::avx::OrientedDiscMiMBIntersector1<8,_true>::intersect
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *Disc)

{
  undefined1 (*pauVar1) [12];
  undefined8 *puVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  undefined4 uVar8;
  Geometry *pGVar9;
  long lVar10;
  long lVar11;
  RTCFilterFunctionN p_Var12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  float fVar17;
  undefined1 auVar18 [32];
  undefined8 uVar19;
  undefined8 uVar20;
  undefined1 auVar21 [24];
  undefined1 auVar22 [24];
  int iVar23;
  uint uVar24;
  uint uVar25;
  long lVar26;
  ulong uVar27;
  long lVar28;
  ulong uVar29;
  ulong uVar30;
  Scene *pSVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  float fVar43;
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar55 [32];
  float fVar56;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  float fVar73;
  float fVar74;
  float fVar75;
  undefined1 auVar71 [32];
  undefined1 auVar72 [64];
  undefined1 auVar76 [32];
  float fVar79;
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  float fVar80;
  float fVar82;
  undefined1 auVar81 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vbool<8> valid;
  int local_304;
  Scene *local_300;
  RayQueryContext *local_2f8;
  RTCFilterFunctionNArguments local_2f0;
  Primitive *local_2c0;
  RayHit *local_2b8;
  float local_2b0;
  undefined4 local_2ac;
  float local_2a8;
  undefined4 local_2a4;
  undefined4 local_2a0;
  uint local_29c;
  uint local_298;
  uint local_294;
  uint local_290;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float local_1e0;
  float fStack_1dc;
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [16];
  undefined1 local_190 [16];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  float local_e0 [4];
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar59 [64];
  
  local_2c0 = Disc;
  local_2b8 = ray;
  local_2f8 = context;
  pSVar31 = context->scene;
  uVar25 = Disc->sharedGeomID;
  local_300 = pSVar31;
  pGVar9 = (pSVar31->geometries).items[uVar25].ptr;
  fVar43 = (pGVar9->time_range).lower;
  fVar43 = pGVar9->fnumTimeSegments *
           (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar43) /
           ((pGVar9->time_range).upper - fVar43));
  auVar13 = vroundss_avx(ZEXT416((uint)fVar43),ZEXT416((uint)fVar43),9);
  auVar13 = vminss_avx(auVar13,ZEXT416((uint)(pGVar9->fnumTimeSegments + -1.0)));
  auVar13 = vmaxss_avx(ZEXT816(0) << 0x20,auVar13);
  iVar23 = (int)auVar13._0_4_;
  uVar36 = (ulong)(Disc->primIDs).field_0.i[0];
  lVar10 = *(long *)&pGVar9[2].numPrimitives;
  lVar26 = (long)iVar23 * 0x38;
  lVar11 = *(long *)(lVar10 + lVar26);
  lVar28 = *(long *)(lVar10 + 0x10 + lVar26);
  uVar34 = (ulong)(Disc->primIDs).field_0.i[1];
  pauVar1 = (undefined1 (*) [12])(lVar11 + lVar28 * uVar34);
  uVar29 = (ulong)(Disc->primIDs).field_0.i[2];
  uVar27 = (ulong)(Disc->primIDs).field_0.i[3];
  uVar33 = (ulong)(Disc->primIDs).field_0.i[4];
  auVar44._16_16_ = *(undefined1 (*) [16])(lVar11 + lVar28 * uVar33);
  auVar44._0_16_ = *(undefined1 (*) [16])(lVar11 + lVar28 * uVar36);
  uVar30 = (ulong)(Disc->primIDs).field_0.i[5];
  puVar2 = (undefined8 *)(lVar11 + lVar28 * uVar30);
  uVar19 = *puVar2;
  uVar20 = puVar2[1];
  fStack_1d4 = (float)((ulong)*(undefined8 *)(*pauVar1 + 8) >> 0x20);
  fStack_1d0 = (float)uVar19;
  fStack_1cc = (float)((ulong)uVar19 >> 0x20);
  fStack_1c8 = (float)uVar20;
  fStack_1c4 = (float)((ulong)uVar20 >> 0x20);
  uVar35 = (ulong)(Disc->primIDs).field_0.i[6];
  auVar55._16_16_ = *(undefined1 (*) [16])(lVar11 + lVar28 * uVar35);
  auVar55._0_16_ = *(undefined1 (*) [16])(lVar11 + lVar28 * uVar29);
  uVar32 = (ulong)(Disc->primIDs).field_0.i[7];
  auVar57._16_16_ = *(undefined1 (*) [16])(lVar11 + lVar28 * uVar32);
  auVar57._0_16_ = *(undefined1 (*) [16])(lVar11 + lVar28 * uVar27);
  p_Var12 = pGVar9[2].intersectionFilterN;
  lVar11 = *(long *)(p_Var12 + lVar26);
  lVar28 = *(long *)(p_Var12 + lVar26 + 0x10);
  auVar66._16_16_ = *(undefined1 (*) [16])(lVar11 + lVar28 * uVar33);
  auVar66._0_16_ = *(undefined1 (*) [16])(lVar11 + lVar28 * uVar36);
  auVar68._16_16_ = *(undefined1 (*) [16])(lVar11 + lVar28 * uVar30);
  auVar68._0_16_ = *(undefined1 (*) [16])(lVar11 + lVar28 * uVar34);
  auVar48._16_16_ = *(undefined1 (*) [16])(lVar11 + lVar28 * uVar35);
  auVar48._0_16_ = *(undefined1 (*) [16])(lVar11 + lVar28 * uVar29);
  auVar76._16_16_ = *(undefined1 (*) [16])(lVar11 + lVar28 * uVar32);
  auVar76._0_16_ = *(undefined1 (*) [16])(lVar11 + lVar28 * uVar27);
  lVar28 = (long)(iVar23 + 1) * 0x38;
  lVar11 = *(long *)(lVar10 + lVar28);
  lVar10 = *(long *)(lVar10 + 0x10 + lVar28);
  auVar77._16_16_ = *(undefined1 (*) [16])(lVar11 + lVar10 * uVar33);
  auVar77._0_16_ = *(undefined1 (*) [16])(lVar11 + lVar10 * uVar36);
  auVar81._16_16_ = *(undefined1 (*) [16])(lVar11 + lVar10 * uVar30);
  auVar81._0_16_ = *(undefined1 (*) [16])(lVar11 + lVar10 * uVar34);
  auVar83._16_16_ = *(undefined1 (*) [16])(lVar11 + lVar10 * uVar35);
  auVar83._0_16_ = *(undefined1 (*) [16])(lVar11 + lVar10 * uVar29);
  auVar84._16_16_ = *(undefined1 (*) [16])(lVar11 + lVar10 * uVar32);
  auVar84._0_16_ = *(undefined1 (*) [16])(lVar11 + lVar10 * uVar27);
  lVar10 = *(long *)(p_Var12 + lVar28);
  lVar11 = *(long *)(p_Var12 + lVar28 + 0x10);
  auVar85._16_16_ = *(undefined1 (*) [16])(lVar10 + uVar33 * lVar11);
  auVar85._0_16_ = *(undefined1 (*) [16])(lVar10 + uVar36 * lVar11);
  fVar43 = fVar43 - auVar13._0_4_;
  auVar45 = vunpcklps_avx(auVar44,auVar55);
  local_80 = vunpckhps_avx(auVar44,auVar55);
  auVar15._12_4_ = fStack_1d4;
  auVar15._0_12_ = *pauVar1;
  auVar15._16_4_ = fStack_1d0;
  auVar15._20_4_ = fStack_1cc;
  auVar15._24_4_ = fStack_1c8;
  auVar15._28_4_ = fStack_1c4;
  auVar44 = vunpcklps_avx(auVar15,auVar57);
  local_a0 = vunpckhps_avx(auVar15,auVar57);
  auVar16 = vunpcklps_avx(auVar45,auVar44);
  auVar45 = vunpckhps_avx(auVar45,auVar44);
  auVar40 = vunpcklps_avx(auVar66,auVar48);
  auVar44 = vunpckhps_avx(auVar66,auVar48);
  auVar46 = vunpcklps_avx(auVar68,auVar76);
  auVar15 = vunpckhps_avx(auVar68,auVar76);
  auVar69._16_16_ = *(undefined1 (*) [16])(lVar10 + uVar35 * lVar11);
  auVar69._0_16_ = *(undefined1 (*) [16])(lVar10 + uVar29 * lVar11);
  auVar41 = vunpcklps_avx(auVar44,auVar15);
  auVar55 = vunpcklps_avx(auVar40,auVar46);
  auVar44 = vunpckhps_avx(auVar40,auVar46);
  auVar15 = vunpcklps_avx(auVar77,auVar83);
  auVar48 = vunpckhps_avx(auVar77,auVar83);
  auVar40 = vunpcklps_avx(auVar81,auVar84);
  local_c0 = vunpckhps_avx(auVar81,auVar84);
  auVar49 = vunpcklps_avx(auVar15,auVar40);
  auVar15 = vunpckhps_avx(auVar15,auVar40);
  auVar50 = vunpcklps_avx(auVar85,auVar69);
  auVar40 = vunpckhps_avx(auVar85,auVar69);
  auVar78._16_16_ = *(undefined1 (*) [16])(lVar10 + uVar30 * lVar11);
  auVar78._0_16_ = *(undefined1 (*) [16])(lVar10 + uVar34 * lVar11);
  auVar70._16_16_ = *(undefined1 (*) [16])(lVar10 + lVar11 * uVar32);
  auVar70._0_16_ = *(undefined1 (*) [16])(lVar10 + uVar27 * lVar11);
  auVar57 = vunpcklps_avx(auVar78,auVar70);
  auVar46 = vunpckhps_avx(auVar78,auVar70);
  auVar40 = vunpcklps_avx(auVar40,auVar46);
  auVar66 = vunpcklps_avx(auVar50,auVar57);
  auVar46 = vunpckhps_avx(auVar50,auVar57);
  auVar13 = vshufps_avx(ZEXT416((uint)fVar43),ZEXT416((uint)fVar43),0);
  auVar14 = vshufps_avx(ZEXT416((uint)(1.0 - fVar43)),ZEXT416((uint)(1.0 - fVar43)),0);
  fVar52 = auVar13._0_4_;
  fVar53 = auVar13._4_4_;
  fVar54 = auVar13._8_4_;
  fVar51 = auVar13._12_4_;
  fVar73 = auVar14._0_4_;
  fVar74 = auVar14._4_4_;
  fVar75 = auVar14._8_4_;
  fVar79 = auVar14._12_4_;
  local_1e0 = fVar73 * auVar16._0_4_ + auVar49._0_4_ * fVar52;
  fStack_1dc = fVar74 * auVar16._4_4_ + auVar49._4_4_ * fVar53;
  fStack_1d8 = fVar75 * auVar16._8_4_ + auVar49._8_4_ * fVar54;
  fStack_1d4 = fVar79 * auVar16._12_4_ + auVar49._12_4_ * fVar51;
  fStack_1d0 = fVar73 * auVar16._16_4_ + auVar49._16_4_ * fVar52;
  fStack_1cc = fVar74 * auVar16._20_4_ + auVar49._20_4_ * fVar53;
  fStack_1c8 = fVar75 * auVar16._24_4_ + auVar49._24_4_ * fVar54;
  fStack_1c4 = auVar16._28_4_ + 0.0;
  auVar49 = vunpcklps_avx(local_80,local_a0);
  local_200._0_4_ = auVar45._0_4_;
  local_200._4_4_ = auVar45._4_4_;
  fStack_1f8 = auVar45._8_4_;
  fStack_1f4 = auVar45._12_4_;
  fStack_1f0 = auVar45._16_4_;
  fStack_1ec = auVar45._20_4_;
  fStack_1e8 = auVar45._24_4_;
  auVar71._0_4_ = fVar73 * (float)local_200._0_4_ + fVar52 * auVar15._0_4_;
  auVar71._4_4_ = fVar74 * (float)local_200._4_4_ + fVar53 * auVar15._4_4_;
  auVar71._8_4_ = fVar75 * fStack_1f8 + fVar54 * auVar15._8_4_;
  auVar71._12_4_ = fVar79 * fStack_1f4 + fVar51 * auVar15._12_4_;
  auVar71._16_4_ = fVar73 * fStack_1f0 + fVar52 * auVar15._16_4_;
  auVar71._20_4_ = fVar74 * fStack_1ec + fVar53 * auVar15._20_4_;
  auVar71._24_4_ = fVar75 * fStack_1e8 + fVar54 * auVar15._24_4_;
  auVar71._28_4_ = local_a0._28_4_ + auVar16._28_4_;
  _local_200 = auVar48;
  auVar45 = vunpcklps_avx(auVar48,local_c0);
  local_260._0_4_ = fVar73 * auVar49._0_4_ + fVar52 * auVar45._0_4_;
  local_260._4_4_ = fVar74 * auVar49._4_4_ + fVar53 * auVar45._4_4_;
  local_260._8_4_ = fVar75 * auVar49._8_4_ + fVar54 * auVar45._8_4_;
  local_260._12_4_ = fVar79 * auVar49._12_4_ + fVar51 * auVar45._12_4_;
  local_260._16_4_ = fVar73 * auVar49._16_4_ + fVar52 * auVar45._16_4_;
  local_260._20_4_ = fVar74 * auVar49._20_4_ + fVar53 * auVar45._20_4_;
  local_260._24_4_ = fVar75 * auVar49._24_4_ + fVar54 * auVar45._24_4_;
  local_260._28_4_ = auVar49._28_4_ + auVar45._28_4_;
  fVar17 = auVar48._28_4_;
  fVar56 = fVar73 * auVar55._0_4_ + auVar66._0_4_ * fVar52;
  fVar60 = fVar74 * auVar55._4_4_ + auVar66._4_4_ * fVar53;
  fVar61 = fVar75 * auVar55._8_4_ + auVar66._8_4_ * fVar54;
  fVar62 = fVar79 * auVar55._12_4_ + auVar66._12_4_ * fVar51;
  fVar63 = fVar73 * auVar55._16_4_ + auVar66._16_4_ * fVar52;
  fVar64 = fVar74 * auVar55._20_4_ + auVar66._20_4_ * fVar53;
  fVar65 = fVar75 * auVar55._24_4_ + auVar66._24_4_ * fVar54;
  local_220._0_4_ = auVar44._0_4_;
  local_220._4_4_ = auVar44._4_4_;
  uStack_218._0_4_ = auVar44._8_4_;
  uStack_218._4_4_ = auVar44._12_4_;
  uStack_210._0_4_ = auVar44._16_4_;
  uStack_210._4_4_ = auVar44._20_4_;
  uStack_208._0_4_ = auVar44._24_4_;
  fVar80 = fVar73 * (float)local_220 + fVar52 * auVar46._0_4_;
  fVar82 = fVar74 * local_220._4_4_ + fVar53 * auVar46._4_4_;
  uStack_218._0_4_ = fVar75 * (float)uStack_218 + fVar54 * auVar46._8_4_;
  uStack_218._4_4_ = fVar79 * uStack_218._4_4_ + fVar51 * auVar46._12_4_;
  uStack_210._0_4_ = fVar73 * (float)uStack_210 + fVar52 * auVar46._16_4_;
  uStack_210._4_4_ = fVar74 * uStack_210._4_4_ + fVar53 * auVar46._20_4_;
  uStack_208._0_4_ = fVar75 * (float)uStack_208 + fVar54 * auVar46._24_4_;
  local_280._0_4_ = auVar41._0_4_;
  local_280._4_4_ = auVar41._4_4_;
  uStack_278._0_4_ = auVar41._8_4_;
  uStack_278._4_4_ = auVar41._12_4_;
  uStack_270._0_4_ = auVar41._16_4_;
  uStack_270._4_4_ = auVar41._20_4_;
  uStack_268._0_4_ = auVar41._24_4_;
  local_190 = vshufps_avx(ZEXT416(uVar25),ZEXT416(uVar25),0);
  local_1a0 = local_190;
  fVar43 = (ray->super_RayK<1>).dir.field_0.m128[1];
  local_e0[0] = auVar40._0_4_ * fVar52 + fVar73 * (float)local_280;
  local_e0[1] = auVar40._4_4_ * fVar53 + fVar74 * local_280._4_4_;
  local_e0[2] = auVar40._8_4_ * fVar54 + fVar75 * (float)uStack_278;
  local_e0[3] = auVar40._12_4_ * fVar51 + fVar79 * uStack_278._4_4_;
  fStack_d0 = auVar40._16_4_ * fVar52 + fVar73 * (float)uStack_270;
  fStack_cc = auVar40._20_4_ * fVar53 + fVar74 * uStack_270._4_4_;
  fStack_c8 = auVar40._24_4_ * fVar54 + fVar75 * (float)uStack_268;
  fVar3 = (ray->super_RayK<1>).dir.field_0.m128[2];
  fVar4 = (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar40._0_4_ = fVar4 * fVar56 + fVar43 * fVar80 + fVar3 * local_e0[0];
  auVar40._4_4_ = fVar4 * fVar60 + fVar43 * fVar82 + fVar3 * local_e0[1];
  auVar40._8_4_ = fVar4 * fVar61 + fVar43 * (float)uStack_218 + fVar3 * local_e0[2];
  auVar40._12_4_ = fVar4 * fVar62 + fVar43 * uStack_218._4_4_ + fVar3 * local_e0[3];
  auVar40._16_4_ = fVar4 * fVar63 + fVar43 * (float)uStack_210 + fVar3 * fStack_d0;
  auVar40._20_4_ = fVar4 * fVar64 + fVar43 * uStack_210._4_4_ + fVar3 * fStack_cc;
  auVar40._24_4_ = fVar4 * fVar65 + fVar43 * (float)uStack_208 + fVar3 * fStack_c8;
  auVar40._28_4_ = auVar15._28_4_ + fVar17 + 0.0;
  auVar13 = vpshufd_avx(ZEXT116(Disc->numPrimitives),0);
  auVar45._16_16_ = auVar13;
  auVar45._0_16_ = auVar13;
  auVar45 = vcvtdq2ps_avx(auVar45);
  auVar44 = vcmpps_avx(_DAT_02020f40,auVar45,1);
  auVar15 = vcmpps_avx(auVar40,ZEXT1632(ZEXT816(0) << 0x40),0);
  auVar86._8_4_ = 0x3f800000;
  auVar86._0_8_ = &DAT_3f8000003f800000;
  auVar86._12_4_ = 0x3f800000;
  auVar86._16_4_ = 0x3f800000;
  auVar86._20_4_ = 0x3f800000;
  auVar86._24_4_ = 0x3f800000;
  auVar86._28_4_ = 0x3f800000;
  auVar45 = vblendvps_avx(auVar40,auVar86,auVar15);
  fVar5 = (ray->super_RayK<1>).org.field_0.m128[1];
  auVar41._4_4_ = fVar5;
  auVar41._0_4_ = fVar5;
  auVar41._8_4_ = fVar5;
  auVar41._12_4_ = fVar5;
  auVar41._16_4_ = fVar5;
  auVar41._20_4_ = fVar5;
  auVar41._24_4_ = fVar5;
  auVar41._28_4_ = fVar5;
  auVar44 = vandnps_avx(auVar15,auVar44);
  fVar6 = (ray->super_RayK<1>).org.field_0.m128[2];
  auVar87._4_4_ = fVar6;
  auVar87._0_4_ = fVar6;
  auVar87._8_4_ = fVar6;
  auVar87._12_4_ = fVar6;
  auVar87._16_4_ = fVar6;
  auVar87._20_4_ = fVar6;
  auVar87._24_4_ = fVar6;
  auVar87._28_4_ = fVar6;
  auVar15 = vsubps_avx(local_260,auVar87);
  auVar40 = vsubps_avx(auVar71,auVar41);
  local_220 = CONCAT44(fVar82,fVar80);
  auVar22 = _local_220;
  uStack_208._4_4_ = fVar17 + auVar46._28_4_;
  auVar55 = _local_220;
  fVar7 = (ray->super_RayK<1>).org.field_0.m128[0];
  auVar46._4_4_ = fVar7;
  auVar46._0_4_ = fVar7;
  auVar46._8_4_ = fVar7;
  auVar46._12_4_ = fVar7;
  auVar46._16_4_ = fVar7;
  auVar46._20_4_ = fVar7;
  auVar46._24_4_ = fVar7;
  auVar46._28_4_ = fVar7;
  auVar16._4_4_ = fStack_1dc;
  auVar16._0_4_ = local_1e0;
  auVar16._8_4_ = fStack_1d8;
  auVar16._12_4_ = fStack_1d4;
  auVar16._16_4_ = fStack_1d0;
  auVar16._20_4_ = fStack_1cc;
  auVar16._24_4_ = fStack_1c8;
  auVar16._28_4_ = fStack_1c4;
  auVar46 = vsubps_avx(auVar16,auVar46);
  local_280 = CONCAT44(fVar60,fVar56);
  uStack_278._0_4_ = fVar61;
  uStack_278._4_4_ = fVar62;
  uStack_270._0_4_ = fVar63;
  uStack_270._4_4_ = fVar64;
  auVar21 = _local_280;
  uStack_268._0_4_ = fVar65;
  uStack_268._4_4_ = fVar17 + auVar49._28_4_;
  auVar41 = _local_280;
  auVar49._0_4_ = auVar46._0_4_ * fVar56 + fVar80 * auVar40._0_4_ + local_e0[0] * auVar15._0_4_;
  auVar49._4_4_ = auVar46._4_4_ * fVar60 + fVar82 * auVar40._4_4_ + local_e0[1] * auVar15._4_4_;
  auVar49._8_4_ =
       auVar46._8_4_ * fVar61 + (float)uStack_218 * auVar40._8_4_ + local_e0[2] * auVar15._8_4_;
  auVar49._12_4_ =
       auVar46._12_4_ * fVar62 + uStack_218._4_4_ * auVar40._12_4_ + local_e0[3] * auVar15._12_4_;
  auVar49._16_4_ =
       auVar46._16_4_ * fVar63 + (float)uStack_210 * auVar40._16_4_ + fStack_d0 * auVar15._16_4_;
  auVar49._20_4_ =
       auVar46._20_4_ * fVar64 + uStack_210._4_4_ * auVar40._20_4_ + fStack_cc * auVar15._20_4_;
  auVar49._24_4_ =
       auVar46._24_4_ * fVar65 + (float)uStack_208 * auVar40._24_4_ + fStack_c8 * auVar15._24_4_;
  auVar49._28_4_ = auVar46._28_4_ + auVar40._28_4_ + auVar15._28_4_;
  local_140 = vdivps_avx(auVar49,auVar45);
  auVar72 = ZEXT3264(local_140);
  uVar8 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar50._4_4_ = uVar8;
  auVar50._0_4_ = uVar8;
  auVar50._8_4_ = uVar8;
  auVar50._12_4_ = uVar8;
  auVar50._16_4_ = uVar8;
  auVar50._20_4_ = uVar8;
  auVar50._24_4_ = uVar8;
  auVar50._28_4_ = uVar8;
  fVar56 = (ray->super_RayK<1>).tfar;
  auVar67._4_4_ = fVar56;
  auVar67._0_4_ = fVar56;
  auVar67._8_4_ = fVar56;
  auVar67._12_4_ = fVar56;
  auVar67._16_4_ = fVar56;
  auVar67._20_4_ = fVar56;
  auVar67._24_4_ = fVar56;
  auVar67._28_4_ = fVar56;
  auVar45 = vcmpps_avx(auVar50,local_140,2);
  auVar15 = vcmpps_avx(local_140,auVar67,2);
  auVar45 = vandps_avx(auVar45,auVar15);
  auVar15 = auVar44 & auVar45;
  if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar15 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar15 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar15 >> 0x7f,0) != '\0') ||
        (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar15 >> 0xbf,0) != '\0') ||
      (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar15[0x1f] < '\0') {
    auVar45 = vandps_avx(auVar44,auVar45);
    auVar44 = vunpckhps_avx(local_80,local_a0);
    auVar15 = vunpckhps_avx(auVar48,local_c0);
    fVar56 = fVar73 * auVar44._0_4_ + fVar52 * auVar15._0_4_;
    fVar60 = fVar74 * auVar44._4_4_ + fVar53 * auVar15._4_4_;
    fVar61 = fVar75 * auVar44._8_4_ + fVar54 * auVar15._8_4_;
    fVar51 = fVar79 * auVar44._12_4_ + fVar51 * auVar15._12_4_;
    fVar52 = fVar73 * auVar44._16_4_ + fVar52 * auVar15._16_4_;
    fVar53 = fVar74 * auVar44._20_4_ + fVar53 * auVar15._20_4_;
    fVar54 = fVar75 * auVar44._24_4_ + fVar54 * auVar15._24_4_;
    fVar62 = local_140._0_4_;
    fVar63 = local_140._4_4_;
    fVar64 = local_140._8_4_;
    fVar65 = local_140._12_4_;
    fVar73 = local_140._16_4_;
    fVar74 = local_140._20_4_;
    fVar75 = local_140._24_4_;
    auVar37._0_4_ = fVar7 + fVar62 * fVar4;
    auVar37._4_4_ = fVar7 + fVar63 * fVar4;
    auVar37._8_4_ = fVar7 + fVar64 * fVar4;
    auVar37._12_4_ = fVar7 + fVar65 * fVar4;
    auVar37._16_4_ = fVar7 + fVar73 * fVar4;
    auVar37._20_4_ = fVar7 + fVar74 * fVar4;
    auVar37._24_4_ = fVar7 + fVar75 * fVar4;
    auVar37._28_4_ = fVar7 + fVar4;
    auVar42._0_4_ = fVar5 + fVar43 * fVar62;
    auVar42._4_4_ = fVar5 + fVar43 * fVar63;
    auVar42._8_4_ = fVar5 + fVar43 * fVar64;
    auVar42._12_4_ = fVar5 + fVar43 * fVar65;
    auVar42._16_4_ = fVar5 + fVar43 * fVar73;
    auVar42._20_4_ = fVar5 + fVar43 * fVar74;
    auVar42._24_4_ = fVar5 + fVar43 * fVar75;
    auVar42._28_4_ = fVar5 + fVar7;
    auVar47._0_4_ = fVar6 + fVar3 * fVar62;
    auVar47._4_4_ = fVar6 + fVar3 * fVar63;
    auVar47._8_4_ = fVar6 + fVar3 * fVar64;
    auVar47._12_4_ = fVar6 + fVar3 * fVar65;
    auVar47._16_4_ = fVar6 + fVar3 * fVar73;
    auVar47._20_4_ = fVar6 + fVar3 * fVar74;
    auVar47._24_4_ = fVar6 + fVar3 * fVar75;
    auVar47._28_4_ = fVar6 + fVar7;
    auVar44 = vsubps_avx(auVar37,auVar16);
    auVar15 = vsubps_avx(auVar42,auVar71);
    auVar40 = vsubps_avx(auVar47,local_260);
    fVar43 = auVar15._28_4_ + auVar40._28_4_;
    auVar38._0_4_ =
         auVar44._0_4_ * auVar44._0_4_ +
         auVar15._0_4_ * auVar15._0_4_ + auVar40._0_4_ * auVar40._0_4_;
    auVar38._4_4_ =
         auVar44._4_4_ * auVar44._4_4_ +
         auVar15._4_4_ * auVar15._4_4_ + auVar40._4_4_ * auVar40._4_4_;
    auVar38._8_4_ =
         auVar44._8_4_ * auVar44._8_4_ +
         auVar15._8_4_ * auVar15._8_4_ + auVar40._8_4_ * auVar40._8_4_;
    auVar38._12_4_ =
         auVar44._12_4_ * auVar44._12_4_ +
         auVar15._12_4_ * auVar15._12_4_ + auVar40._12_4_ * auVar40._12_4_;
    auVar38._16_4_ =
         auVar44._16_4_ * auVar44._16_4_ +
         auVar15._16_4_ * auVar15._16_4_ + auVar40._16_4_ * auVar40._16_4_;
    auVar38._20_4_ =
         auVar44._20_4_ * auVar44._20_4_ +
         auVar15._20_4_ * auVar15._20_4_ + auVar40._20_4_ * auVar40._20_4_;
    auVar38._24_4_ =
         auVar44._24_4_ * auVar44._24_4_ +
         auVar15._24_4_ * auVar15._24_4_ + auVar40._24_4_ * auVar40._24_4_;
    auVar38._28_4_ = auVar44._28_4_ + fVar43;
    auVar18._4_4_ = fVar60 * fVar60;
    auVar18._0_4_ = fVar56 * fVar56;
    auVar18._8_4_ = fVar61 * fVar61;
    auVar18._12_4_ = fVar51 * fVar51;
    auVar18._16_4_ = fVar52 * fVar52;
    auVar18._20_4_ = fVar53 * fVar53;
    auVar18._24_4_ = fVar54 * fVar54;
    auVar18._28_4_ = fVar43;
    auVar44 = vcmpps_avx(auVar38,auVar18,1);
    auVar15 = auVar45 & auVar44;
    if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar15 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar15 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar15 >> 0x7f,0) != '\0') ||
          (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar15 >> 0xbf,0) != '\0') ||
        (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar15[0x1f] < '\0')
    {
      auVar45 = vandps_avx(auVar45,auVar44);
      local_160 = ZEXT432(0) << 0x20;
      local_180 = ZEXT432(0) << 0x20;
      uStack_270 = auVar21._16_8_;
      uStack_268 = auVar41._24_8_;
      local_120 = local_280;
      uStack_118 = uStack_278;
      uStack_110 = uStack_270;
      uStack_108 = uStack_268;
      uStack_210 = auVar22._16_8_;
      uStack_208 = auVar55._24_8_;
      local_100 = local_220;
      uStack_f8 = uStack_218;
      uStack_f0 = uStack_210;
      uStack_e8 = uStack_208;
      fStack_c4 = local_c0._28_4_ + fVar17;
      local_240 = auVar45;
      auVar58._8_4_ = 0x7f800000;
      auVar58._0_8_ = 0x7f8000007f800000;
      auVar58._12_4_ = 0x7f800000;
      auVar58._16_4_ = 0x7f800000;
      auVar58._20_4_ = 0x7f800000;
      auVar58._24_4_ = 0x7f800000;
      auVar58._28_4_ = 0x7f800000;
      auVar59 = ZEXT3264(auVar58);
      auVar44 = vblendvps_avx(auVar58,local_140,auVar45);
      auVar15 = vshufps_avx(auVar44,auVar44,0xb1);
      auVar15 = vminps_avx(auVar44,auVar15);
      auVar40 = vshufpd_avx(auVar15,auVar15,5);
      auVar15 = vminps_avx(auVar15,auVar40);
      auVar40 = vperm2f128_avx(auVar15,auVar15,1);
      auVar15 = vminps_avx(auVar15,auVar40);
      auVar44 = vcmpps_avx(auVar44,auVar15,0);
      auVar15 = auVar45 & auVar44;
      if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar15 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar15 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar15 >> 0x7f,0) != '\0') ||
            (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar15 >> 0xbf,0) != '\0') ||
          (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar15[0x1f] < '\0') {
        auVar45 = vandps_avx(auVar44,auVar45);
      }
      uVar24 = vmovmskps_avx(auVar45);
      uVar25 = 0;
      _local_280 = auVar41;
      _local_220 = auVar55;
      if (uVar24 != 0) {
        for (; (uVar24 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
        }
      }
      do {
        uVar27 = (ulong)uVar25;
        local_298 = *(uint *)(local_1a0 + uVar27 * 4);
        pGVar9 = (pSVar31->geometries).items[local_298].ptr;
        if ((pGVar9->mask & (ray->super_RayK<1>).mask) == 0) {
          *(undefined4 *)(local_240 + uVar27 * 4) = 0;
        }
        else {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
            fVar43 = *(float *)(local_180 + uVar27 * 4);
            fVar3 = *(float *)(local_160 + uVar27 * 4);
            (ray->super_RayK<1>).tfar = *(float *)(local_140 + uVar27 * 4);
            (ray->Ng).field_0.field_0.x = *(float *)((long)&local_120 + uVar27 * 4);
            (ray->Ng).field_0.field_0.y = *(float *)((long)&local_100 + uVar27 * 4);
            (ray->Ng).field_0.field_0.z = local_e0[uVar27];
            ray->u = fVar43;
            ray->v = fVar3;
            ray->primID = (Disc->primIDs).field_0.i[uVar27];
            ray->geomID = local_298;
            ray->instID[0] = context->user->instID[0];
            ray->instPrimID[0] = context->user->instPrimID[0];
            return;
          }
          local_2b0 = *(float *)((long)&local_120 + uVar27 * 4);
          local_2ac = *(undefined4 *)((long)&local_100 + uVar27 * 4);
          local_2a8 = local_e0[uVar27];
          local_2a4 = *(undefined4 *)(local_180 + uVar27 * 4);
          local_2a0 = *(undefined4 *)(local_160 + uVar27 * 4);
          local_29c = (Disc->primIDs).field_0.i[uVar27];
          local_294 = context->user->instID[0];
          local_290 = context->user->instPrimID[0];
          local_260._0_4_ = (ray->super_RayK<1>).tfar;
          (ray->super_RayK<1>).tfar = *(float *)(local_140 + uVar27 * 4);
          local_304 = -1;
          local_2f0.valid = &local_304;
          local_2f0.geometryUserPtr = pGVar9->userPtr;
          local_2f0.context = context->user;
          local_2f0.ray = (RTCRayN *)ray;
          local_2f0.hit = (RTCHitN *)&local_2b0;
          local_2f0.N = 1;
          local_1c0 = auVar72._0_32_;
          if (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_011c0afc:
            p_Var12 = context->args->filter;
            if (p_Var12 != (RTCFilterFunctionN)0x0) {
              if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT) || (((pGVar9->field_8).field_0x2 & 0x40) != 0)) {
                (*p_Var12)(&local_2f0);
                auVar59 = ZEXT3264(CONCAT428(0x7f800000,
                                             CONCAT424(0x7f800000,
                                                       CONCAT420(0x7f800000,
                                                                 CONCAT416(0x7f800000,
                                                                           CONCAT412(0x7f800000,
                                                                                     CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
                auVar72 = ZEXT3264(local_1c0);
                pSVar31 = local_300;
              }
              if (*local_2f0.valid == 0) goto LAB_011c0c05;
            }
            (((Vec3f *)((long)local_2f0.ray + 0x30))->field_0).field_0.x = *(float *)local_2f0.hit;
            (((Vec3f *)((long)local_2f0.ray + 0x30))->field_0).field_0.y =
                 *(float *)(local_2f0.hit + 4);
            (((Vec3f *)((long)local_2f0.ray + 0x30))->field_0).field_0.z =
                 *(float *)(local_2f0.hit + 8);
            *(float *)((long)local_2f0.ray + 0x3c) = *(float *)(local_2f0.hit + 0xc);
            *(float *)((long)local_2f0.ray + 0x40) = *(float *)(local_2f0.hit + 0x10);
            *(float *)((long)local_2f0.ray + 0x44) = *(float *)(local_2f0.hit + 0x14);
            *(float *)((long)local_2f0.ray + 0x48) = *(float *)(local_2f0.hit + 0x18);
            *(float *)((long)local_2f0.ray + 0x4c) = *(float *)(local_2f0.hit + 0x1c);
            *(float *)((long)local_2f0.ray + 0x50) = *(float *)(local_2f0.hit + 0x20);
          }
          else {
            (*pGVar9->intersectionFilterN)(&local_2f0);
            auVar59 = ZEXT3264(CONCAT428(0x7f800000,
                                         CONCAT424(0x7f800000,
                                                   CONCAT420(0x7f800000,
                                                             CONCAT416(0x7f800000,
                                                                       CONCAT412(0x7f800000,
                                                                                 CONCAT48(0x7f800000
                                                                                          ,
                                                  0x7f8000007f800000)))))));
            auVar72 = ZEXT3264(local_1c0);
            pSVar31 = local_300;
            if (*local_2f0.valid != 0) goto LAB_011c0afc;
LAB_011c0c05:
            (ray->super_RayK<1>).tfar = (float)local_260._0_4_;
          }
          *(undefined4 *)(local_240 + uVar27 * 4) = 0;
          fVar43 = (ray->super_RayK<1>).tfar;
          auVar39._4_4_ = fVar43;
          auVar39._0_4_ = fVar43;
          auVar39._8_4_ = fVar43;
          auVar39._12_4_ = fVar43;
          auVar39._16_4_ = fVar43;
          auVar39._20_4_ = fVar43;
          auVar39._24_4_ = fVar43;
          auVar39._28_4_ = fVar43;
          auVar45 = vcmpps_avx(auVar72._0_32_,auVar39,2);
          local_240 = vandps_avx(auVar45,local_240);
        }
        if ((((((((local_240 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (local_240 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (local_240 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(local_240 >> 0x7f,0) == '\0') &&
              (local_240 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(local_240 >> 0xbf,0) == '\0') &&
            (local_240 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < local_240[0x1f]) {
          return;
        }
        auVar45 = vblendvps_avx(auVar59._0_32_,auVar72._0_32_,local_240);
        auVar44 = vshufps_avx(auVar45,auVar45,0xb1);
        auVar44 = vminps_avx(auVar45,auVar44);
        auVar15 = vshufpd_avx(auVar44,auVar44,5);
        auVar44 = vminps_avx(auVar44,auVar15);
        auVar15 = vperm2f128_avx(auVar44,auVar44,1);
        auVar44 = vminps_avx(auVar44,auVar15);
        auVar44 = vcmpps_avx(auVar45,auVar44,0);
        auVar15 = local_240 & auVar44;
        auVar45 = local_240;
        if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar15 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar15 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar15 >> 0x7f,0) != '\0') ||
              (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar15 >> 0xbf,0) != '\0') ||
            (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar15[0x1f] < '\0') {
          auVar45 = vandps_avx(auVar44,local_240);
        }
        uVar24 = vmovmskps_avx(auVar45);
        uVar25 = 0;
        if (uVar24 != 0) {
          for (; (uVar24 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
          }
        }
      } while( true );
    }
  }
  return;
}

Assistant:

static __forceinline void intersect(const Precalculations& pre,
                                          RayHit& ray,
                                          RayQueryContext* context,
                                          const Primitive& Disc)
      {
        STAT3(normal.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(Disc.geomID());
        Vec4vf<M> v0; Vec3vf<M> n0;
        Disc.gather(v0, n0, geom, ray.time());
        const vbool<M> valid = Disc.valid();
        DiscIntersector1<M>::intersect(
          valid, ray, context, geom, pre, v0, n0, Intersect1EpilogM<M, filter>(ray, context, Disc.geomID(), Disc.primID()));
      }